

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsOn(cmMakefile *this,string *name)

{
  bool bVar1;
  cmValue local_8;
  
  local_8 = GetDefinition(this,name);
  bVar1 = cmValue::IsOn(&local_8);
  return bVar1;
}

Assistant:

bool cmMakefile::IsOn(const std::string& name) const
{
  return this->GetDefinition(name).IsOn();
}